

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O2

void spell_word_of_recall(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  int iVar2;
  char *txt;
  allocator<char> local_62;
  allocator<char> local_61;
  CHAR_DATA *victim;
  ROOM_INDEX_DATA *location;
  string local_50;
  string local_30;
  
  victim = (CHAR_DATA *)vo;
  bVar1 = trusts(ch,(CHAR_DATA *)vo);
  if (bVar1) {
    location = get_room_index(hometown_table[*(int *)((long)vo + 0x2f8)].recall);
    if ((location == (ROOM_INDEX_DATA *)0x0) &&
       (location = get_room_index(0x9ea), location == (ROOM_INDEX_DATA *)0x0)) {
      txt = "You are completely lost.\n\r";
      ch = (CHAR_DATA *)vo;
    }
    else if ((((*(byte *)(*(long *)((long)vo + 0xa8) + 0x141) & 0x20) != 0) &&
             (bVar1 = is_affected_room(ch->in_room,(int)gsn_consecrate), !bVar1)) ||
            (((bVar1 = is_affected_room(ch->in_room,(int)gsn_plasma_cube), bVar1 &&
              (iVar2 = number_percent(), iVar2 < 0x32)) || (bVar1 = is_npc((CHAR_DATA *)vo), bVar1))
            )) {
      txt = "Spell failed.\n\r";
      ch = (CHAR_DATA *)vo;
    }
    else {
      bVar1 = is_affected((CHAR_DATA *)vo,(int)gsn_bind_feet);
      if (!bVar1) {
        if ((CHAR_DATA *)vo != ch) {
          act("You prepare to send $N home.",ch,(void *)0x0,vo,3);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_30,"spell_word_of_recall",&local_61);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"recall_execute",&local_62);
        CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                  (&RS.Queue,6,&local_30,&local_50,recall_execute,&victim,&location);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_30);
        send_to_char("A tingling feeling runs down your spine for a moment.\n\r",victim);
        victim->disrupted = false;
        return;
      }
      txt = "Your feet are rooted to the ground!\n\r";
      ch = (CHAR_DATA *)vo;
    }
  }
  else {
    txt = "They won\'t allow you to do that to them.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_word_of_recall(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	ROOM_INDEX_DATA *location;

	if (!trusts(ch, victim))
	{
		send_to_char("They won't allow you to do that to them.\n\r", ch);
		return;
	}

	location = get_room_index(hometown_table[victim->hometown].recall);

	if (location == nullptr)
	{
		location = get_room_index(ROOM_VNUM_TEMPLE);

		if (location == nullptr)
		{
			send_to_char("You are completely lost.\n\r", victim);
			return;
		}
	}

	if ((IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL) && !is_affected_room(ch->in_room, gsn_consecrate))
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50)
		|| is_npc(victim))
	{
		send_to_char("Spell failed.\n\r", victim);
		return;
	}

	if (is_affected(victim, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", victim);
		return;
	}

	if (ch != victim)
		act("You prepare to send $N home.", ch, 0, victim, TO_CHAR);

	RS.Queue.AddToQueue(6, "spell_word_of_recall", "recall_execute", recall_execute, victim, location);

	send_to_char("A tingling feeling runs down your spine for a moment.\n\r", victim);

	victim->disrupted = false;
}